

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::ClipperOffset::DoMiter(ClipperOffset *this,int j,int k,double r)

{
  pointer pDVar1;
  pointer pIVar2;
  pointer pDVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  IntPoint local_18;
  
  dVar6 = this->m_delta / r;
  pIVar2 = (this->m_srcPoly).
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
           super__Vector_impl_data._M_start;
  pDVar3 = (this->m_normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar1 = pDVar3 + k;
  pDVar3 = pDVar3 + j;
  dVar7 = dVar6 * (pDVar3->X + pDVar1->X) + (double)pIVar2[j].X;
  dVar6 = dVar6 * (pDVar3->Y + pDVar1->Y) + (double)pIVar2[j].Y;
  uVar4 = -(ulong)(dVar7 < 0.0);
  uVar5 = -(ulong)(dVar6 < 0.0);
  local_18.X = (cInt)((double)(uVar4 & 0xbfe0000000000000 | ~uVar4 & 0x3fe0000000000000) + dVar7);
  local_18.Y = (cInt)((double)(uVar5 & 0xbfe0000000000000 | ~uVar5 & 0x3fe0000000000000) + dVar6);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
  emplace_back<ClipperLib::IntPoint>(&this->m_destPoly,&local_18);
  return;
}

Assistant:

void ClipperOffset::DoMiter(int j, int k, double r)
{
  double q = m_delta / r;
  m_destPoly.push_back(IntPoint(Round(m_srcPoly[j].X + (m_normals[k].X + m_normals[j].X) * q),
      Round(m_srcPoly[j].Y + (m_normals[k].Y + m_normals[j].Y) * q)));
}